

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerStep * triggerStepAllocate(Parse *pParse,u8 op,Token *pName,char *zStart,char *zEnd)

{
  char *pcVar1;
  undefined8 *in_RDX;
  u8 in_SIL;
  undefined8 *in_RDI;
  sqlite3 *in_R8;
  char *z;
  TriggerStep *pTriggerStep;
  sqlite3 *db;
  u64 in_stack_ffffffffffffffb8;
  TriggerStep *z_00;
  char *zStart_00;
  TriggerStep *local_8;
  
  zStart_00 = (char *)*in_RDI;
  if (*(int *)((long)in_RDI + 0x34) == 0) {
    local_8 = (TriggerStep *)
              sqlite3DbMallocZero((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffb8);
    if (local_8 != (TriggerStep *)0x0) {
      z_00 = local_8 + 1;
      memcpy(z_00,(void *)*in_RDX,(ulong)*(uint *)(in_RDX + 1));
      sqlite3Dequote((char *)z_00);
      local_8->zTarget = (char *)z_00;
      local_8->op = in_SIL;
      pcVar1 = triggerSpanDup(in_R8,zStart_00,(char *)local_8);
      local_8->zSpan = pcVar1;
      if (1 < *(byte *)((long)in_RDI + 0x134)) {
        sqlite3RenameTokenMap((Parse *)in_R8,zStart_00,(Token *)local_8);
      }
    }
  }
  else {
    local_8 = (TriggerStep *)0x0;
  }
  return local_8;
}

Assistant:

static TriggerStep *triggerStepAllocate(
  Parse *pParse,              /* Parser context */
  u8 op,                      /* Trigger opcode */
  Token *pName,               /* The target name */
  const char *zStart,         /* Start of SQL text */
  const char *zEnd            /* End of SQL text */
){
  sqlite3 *db = pParse->db;
  TriggerStep *pTriggerStep;

  if( pParse->nErr ) return 0;
  pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep) + pName->n + 1);
  if( pTriggerStep ){
    char *z = (char*)&pTriggerStep[1];
    memcpy(z, pName->z, pName->n);
    sqlite3Dequote(z);
    pTriggerStep->zTarget = z;
    pTriggerStep->op = op;
    pTriggerStep->zSpan = triggerSpanDup(db, zStart, zEnd);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, pTriggerStep->zTarget, pName);
    }
  }
  return pTriggerStep;
}